

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O3

FT_UInt ps_unicodes_char_index(PS_Unicodes table,FT_UInt32 unicode)

{
  PS_UniMap *pPVar1;
  PS_UniMap *pPVar2;
  PS_UniMap *pPVar3;
  PS_UniMap *pPVar4;
  PS_UniMap *pPVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = table->num_maps;
  if ((ulong)uVar6 != 0) {
    pPVar4 = table->maps;
    pPVar3 = pPVar4 + (uVar6 >> 1);
    pPVar5 = pPVar4 + uVar6;
    pPVar2 = (PS_UniMap *)0x0;
    do {
      if (pPVar3->unicode == unicode) goto LAB_0023a21a;
      uVar6 = pPVar3->unicode & 0x7fffffff;
      uVar7 = unicode - uVar6;
      if (uVar7 == 0) {
        pPVar2 = pPVar3;
      }
      pPVar1 = pPVar3 + 1;
      if (unicode < uVar6 || uVar7 == 0) {
        pPVar5 = pPVar3;
        pPVar1 = pPVar4;
      }
      pPVar4 = pPVar1;
      pPVar1 = pPVar3 + uVar7;
      pPVar3 = pPVar1;
      if (pPVar1 < pPVar4) {
        pPVar3 = pPVar4 + ((long)pPVar5 - (long)pPVar4 >> 4);
      }
      if (pPVar5 <= pPVar1) {
        pPVar3 = pPVar4 + ((long)pPVar5 - (long)pPVar4 >> 4);
      }
    } while (pPVar4 < pPVar5);
    pPVar3 = pPVar2;
    if (pPVar2 != (PS_UniMap *)0x0) {
LAB_0023a21a:
      return pPVar3->glyph_index;
    }
  }
  return 0;
}

Assistant:

static FT_UInt
  ps_unicodes_char_index( PS_Unicodes  table,
                          FT_UInt32    unicode )
  {
    PS_UniMap  *result = NULL;
    PS_UniMap  *min = table->maps;
    PS_UniMap  *max = min + table->num_maps;
    PS_UniMap  *mid = min + ( ( max - min ) >> 1 );


    /* Perform a binary search on the table. */
    while ( min < max )
    {
      FT_UInt32  base_glyph;


      if ( mid->unicode == unicode )
      {
        result = mid;
        break;
      }

      base_glyph = BASE_GLYPH( mid->unicode );

      if ( base_glyph == unicode )
        result = mid; /* remember match but continue search for base glyph */

      if ( base_glyph < unicode )
        min = mid + 1;
      else
        max = mid;

      /* reasonable prediction in a continuous block */
      mid += unicode - base_glyph;
      if ( mid >= max || mid < min )
        mid = min + ( ( max - min ) >> 1 );
    }

    if ( result )
      return result->glyph_index;
    else
      return 0;
  }